

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkInterface * __thiscall
cmGeneratorTarget::GetImportLinkInterface
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *headTarget,
          LinkInterfaceFor interfaceFor,bool secondPass)

{
  cmHeadToLinkInterfaceMap *pcVar1;
  SourceEntriesType *pSVar2;
  bool bVar3;
  pointer ppVar4;
  reference n;
  cmLinkItem *__args;
  cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  cVar5;
  string_view sVar6;
  byte local_259;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_258;
  cmListFileBacktrace local_238;
  undefined1 local_228 [8];
  optional<cmLinkItem> maybeItem;
  string *dep;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  LookupLinkItemScope scope;
  undefined1 local_1a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  cmOptionalLinkInterface local_150;
  cmGeneratorTarget *local_58;
  cmOptionalLinkInterface *iface;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_> local_48;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_40;
  cmHeadToLinkInterfaceMap *hm;
  ImportInfo *info;
  bool secondPass_local;
  cmGeneratorTarget *pcStack_28;
  LinkInterfaceFor interfaceFor_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  info._3_1_ = secondPass;
  info._4_4_ = interfaceFor;
  pcStack_28 = headTarget;
  headTarget_local = (cmGeneratorTarget *)config;
  config_local = (string *)this;
  hm = (cmHeadToLinkInterfaceMap *)GetImportInfo(this,config);
  if ((ImportInfo *)hm == (ImportInfo *)0x0) {
    this_local = (cmGeneratorTarget *)0x0;
  }
  else {
    if (info._4_4_ == Usage) {
      local_258 = &GetHeadToLinkInterfaceUsageRequirementsMap(this,(string *)headTarget_local)->
                   super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    else {
      local_258 = &GetHeadToLinkInterfaceMap(this,(string *)headTarget_local)->
                   super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    local_40 = local_258;
    bVar3 = std::
            map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
            ::empty(local_258);
    local_259 = 0;
    if (!bVar3) {
      local_48._M_node =
           (_Base_ptr)
           std::
           map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
           ::begin(local_40);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
               ::operator->(&local_48);
      local_259 = (ppVar4->second).super_cmLinkInterface.super_cmLinkInterfaceLibraries.
                  HadHeadSensitiveCondition ^ 0xff;
    }
    if ((local_259 & 1) != 0) {
      iface = (cmOptionalLinkInterface *)
              std::
              map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
              ::begin(local_40);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                             *)&iface);
      pcStack_28 = ppVar4->first;
    }
    local_58 = (cmGeneratorTarget *)
               std::
               map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
               ::operator[](local_40,&stack0xffffffffffffffd8);
    if ((info._3_1_ & 1) != 0) {
      memset(&local_150,0,0xf8);
      cmOptionalLinkInterface::cmOptionalLinkInterface(&local_150);
      cmOptionalLinkInterface::operator=((cmOptionalLinkInterface *)local_58,&local_150);
      cmOptionalLinkInterface::~cmOptionalLinkInterface(&local_150);
    }
    if (((local_58->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count &
        0x1000000) == 0) {
      *(undefined1 *)
       ((long)&(local_58->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count
       + 3) = 1;
      *(undefined1 *)
       ((long)&(local_58->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count
       + 2) = 1;
      (local_58->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (hm->
           super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      sVar6 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(hm + 3));
      cmExpandList(sVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(local_58->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count,false);
      cVar5 = cmMakeRange<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&hm[4].
                             super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                             ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ExpandLinkItems(this,(string *)
                           (anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,cVar5,
                      (string *)headTarget_local,pcStack_28,info._4_4_,HeadInclude,
                      (cmLinkInterface *)local_58);
      cVar5 = cmMakeRange<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&hm[5].
                             super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      ExpandLinkItems(this,(string *)
                           (anonymous_namespace)::
                           kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,cVar5,
                      (string *)headTarget_local,pcStack_28,info._4_4_,HeadExclude,
                      (cmLinkInterface *)local_58);
      pcVar1 = hm + 3;
      join_0x00000010_0x00000000_ =
           cmMakeRange<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&hm[4].
                          super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                          ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      ExpandLinkItems(this,(string *)
                           &(pcVar1->
                            super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                            )._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                      join_0x00000010_0x00000000_,(string *)headTarget_local,pcStack_28,info._4_4_,
                      Libraries,(cmLinkInterface *)local_58);
      sVar6 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)
                         &hm[5].
                          super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                          ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      scope.LG = (cmLocalGenerator *)sVar6._M_len;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a8,sVar6,false);
      __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this->LocalGenerator;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1a8);
      dep = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a8);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&dep), bVar3) {
        n = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
        local_238.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_238.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        maybeItem.super__Optional_base<cmLinkItem,_false,_false>._M_payload.
        super__Optional_payload<cmLinkItem,_true,_false,_false>.
        super__Optional_payload_base<cmLinkItem>._64_8_ = n;
        cmListFileBacktrace::cmListFileBacktrace(&local_238);
        LookupLinkItem((optional<cmLinkItem> *)local_228,this,n,&local_238,
                       (LookupLinkItemScope *)&__range2,No);
        cmListFileBacktrace::~cmListFileBacktrace(&local_238);
        bVar3 = std::optional::operator_cast_to_bool((optional *)local_228);
        if (bVar3) {
          pSVar2 = &local_58->SourceDepends;
          __args = std::optional<cmLinkItem>::operator*((optional<cmLinkItem> *)local_228);
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                     &(pSVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right,__args);
        }
        std::optional<cmLinkItem>::~optional((optional<cmLinkItem> *)local_228);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a8);
    }
    this_local = local_58;
  }
  return (cmLinkInterface *)this_local;
}

Assistant:

const cmLinkInterface* cmGeneratorTarget::GetImportLinkInterface(
  const std::string& config, cmGeneratorTarget const* headTarget,
  LinkInterfaceFor interfaceFor, bool secondPass) const
{
  cmGeneratorTarget::ImportInfo const* info = this->GetImportInfo(config);
  if (!info) {
    return nullptr;
  }

  cmHeadToLinkInterfaceMap& hm =
    (interfaceFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkInterfaceUsageRequirementsMap(config)
       : this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    headTarget = hm.begin()->first;
  }

  cmOptionalLinkInterface& iface = hm[headTarget];
  if (secondPass) {
    iface = cmOptionalLinkInterface();
  }
  if (!iface.AllDone) {
    iface.AllDone = true;
    iface.LibrariesDone = true;
    iface.Multiplicity = info->Multiplicity;
    cmExpandList(info->Languages, iface.Languages);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT,
                          cmMakeRange(info->LibrariesHeadInclude), config,
                          headTarget, interfaceFor,
                          LinkInterfaceField::HeadInclude, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
                          cmMakeRange(info->LibrariesHeadExclude), config,
                          headTarget, interfaceFor,
                          LinkInterfaceField::HeadExclude, iface);
    this->ExpandLinkItems(info->LibrariesProp, cmMakeRange(info->Libraries),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::Libraries, iface);
    std::vector<std::string> deps = cmExpandedList(info->SharedDeps);
    LookupLinkItemScope scope{ this->LocalGenerator };
    for (std::string const& dep : deps) {
      if (cm::optional<cmLinkItem> maybeItem = this->LookupLinkItem(
            dep, cmListFileBacktrace(), &scope, LookupSelf::No)) {
        iface.SharedDeps.emplace_back(std::move(*maybeItem));
      }
    }
  }

  return &iface;
}